

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

void helper_swr_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1,target_ulong arg2,int mem_idx
                        )

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  
  cpu_stb_mmuidx_ra_mips64el
            ((CPUArchState_conflict14 *)env,arg2,(uint)arg1 & 0xff,mem_idx,unaff_retaddr);
  uVar1 = (uint)arg2 & 3;
  if (uVar1 != 3) {
    cpu_stb_mmuidx_ra_mips64el
              ((CPUArchState_conflict14 *)env,arg2 + 1,(uint)(byte)(arg1 >> 8),mem_idx,unaff_retaddr
              );
    if (1 < (uVar1 ^ 2)) {
      cpu_stb_mmuidx_ra_mips64el
                ((CPUArchState_conflict14 *)env,arg2 + 2,(uint)(arg1 >> 0x10) & 0xff,mem_idx,
                 unaff_retaddr);
    }
    if ((arg2 & 3) == 0) {
      cpu_stb_mmuidx_ra_mips64el
                ((CPUArchState_conflict14 *)env,arg2 | 3,(uint)arg1 >> 0x18,mem_idx,unaff_retaddr);
      return;
    }
  }
  return;
}

Assistant:

void helper_swr(CPUMIPSState *env, target_ulong arg1, target_ulong arg2,
                int mem_idx)
{
    cpu_stb_mmuidx_ra(env, arg2, (uint8_t)arg1, mem_idx, GETPC());

    if (GET_LMASK(arg2) >= 1) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -1), (uint8_t)(arg1 >> 8),
                          mem_idx, GETPC());
    }

    if (GET_LMASK(arg2) >= 2) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -2), (uint8_t)(arg1 >> 16),
                          mem_idx, GETPC());
    }

    if (GET_LMASK(arg2) == 3) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -3), (uint8_t)(arg1 >> 24),
                          mem_idx, GETPC());
    }
}